

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O1

transport_protocol * init_tls(void)

{
  transport_protocol *ptVar1;
  SSL_METHOD *meth;
  
  ptVar1 = (transport_protocol *)malloc(0x20);
  if (ptVar1 == (transport_protocol *)0x0) {
    init_tls_cold_2();
  }
  else {
    ptVar1->tp_main[0] = throughput_ssl_main;
    ptVar1->tp_main[1] = latency_ssl_main;
    ptVar1->tp_main[2] = symmetric_nic_ssl_main;
    ptVar1->tp_main[3] = symmetric_ssl_main;
    OPENSSL_init_ssl(0,0);
    OPENSSL_init_ssl(random_char + 0xd56e2,0);
    meth = (SSL_METHOD *)TLS_client_method();
    ssl_ctx = (SSL_CTX *)SSL_CTX_new(meth);
    if ((SSL_CTX *)ssl_ctx != (SSL_CTX *)0x0) {
      SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x7b,0x303,(void *)0x0);
      SSL_CTX_set_verify((SSL_CTX *)ssl_ctx,0,(callback *)0x0);
      SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x2c,0,(void *)0x0);
      return ptVar1;
    }
    init_tls_cold_1();
  }
  return (transport_protocol *)0x0;
}

Assistant:

struct transport_protocol *init_tls(void)
{
	struct transport_protocol *tp;

	tp = malloc(sizeof(struct transport_protocol));
	if (!tp) {
		lancet_fprintf(stderr, "Failed to alloc transport_protocol\n");
		return NULL;
	}

	tp->tp_main[THROUGHPUT_AGENT] = throughput_ssl_main;
	tp->tp_main[LATENCY_AGENT] = latency_ssl_main;
	tp->tp_main[SYMMETRIC_NIC_TIMESTAMP_AGENT] = symmetric_nic_ssl_main;
	tp->tp_main[SYMMETRIC_AGENT] = symmetric_ssl_main;

	if (ssl_init()) {
		lancet_fprintf(stderr, "Failed to initate TLS\n");
		return NULL;
	}

	return tp;
}